

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KokkosLookup.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_455b80::KokkosLookup::kokkos_deepcopy
          (KokkosLookup *this,void *dst,void *src,uint64_t size)

{
  ChannelBody *chB;
  SnapshotView local_f8;
  cali_variant_t local_e8;
  Variant local_d8;
  Variant local_c8 [2];
  Variant local_a8;
  undefined1 local_98 [8];
  Entry data [3];
  undefined1 local_48 [8];
  Caliper c;
  uint64_t size_local;
  void *src_local;
  void *dst_local;
  KokkosLookup *this_local;
  
  c._24_8_ = size;
  size_local = (uint64_t)src;
  src_local = dst;
  dst_local = this;
  cali::Caliper::Caliper((Caliper *)local_48);
  cali::Variant::Variant(&local_a8,CALI_TYPE_ADDR,&src_local,8);
  cali::Entry::Entry((Entry *)local_98,&this->m_dst_attr,&local_a8);
  cali::Variant::Variant(local_c8,CALI_TYPE_ADDR,&size_local,8);
  cali::Entry::Entry((Entry *)&data[0].m_value.m_v.value,&this->m_src_attr,local_c8);
  local_e8 = cali_make_variant_from_uint(c._24_8_);
  cali::Variant::Variant(&local_d8,&local_e8);
  cali::Entry::Entry((Entry *)&data[1].m_value.m_v.value,&this->m_size_attr,&local_d8);
  chB = cali::Channel::body(&this->m_channel);
  cali::SnapshotView::SnapshotView(&local_f8,3,(Entry *)local_98);
  cali::Caliper::push_snapshot((Caliper *)local_48,chB,local_f8);
  this->m_num_copies = this->m_num_copies + 1;
  cali::Caliper::~Caliper((Caliper *)local_48);
  return;
}

Assistant:

void kokkos_deepcopy(const void* dst, const void* src, uint64_t size)
    {
        Caliper c;

        Entry data[] = { { m_dst_attr, Variant(CALI_TYPE_ADDR, &dst, sizeof(void*)) },
                         { m_src_attr, Variant(CALI_TYPE_ADDR, &src, sizeof(void*)) },
                         { m_size_attr, Variant(cali_make_variant_from_uint(size)) } };

        c.push_snapshot(m_channel.body(), SnapshotView(3, data));

        ++m_num_copies;
    }